

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

int cmd_list(char *arg)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  void *rlcd;
  LYD_FORMAT outformat;
  int option_index;
  int argc;
  int c;
  char *ptr;
  char **argv;
  char *arg_local;
  
  ptr = (char *)0x0;
  rlcd._0_4_ = LYD_UNKNOWN;
  outformat = LYD_XML;
  argv = (char **)arg;
  ptr = (char *)malloc(0x10);
  pcVar2 = strdup((char *)argv);
  *(char **)ptr = pcVar2;
  _argc = strtok(*(char **)ptr," ");
  while (_argc = strtok((char *)0x0," "), _argc != (char *)0x0) {
    pcVar2 = (char *)realloc(ptr,(long)(int)(outformat + LYD_JSON) << 3);
    __stream = _stderr;
    if (pcVar2 == (char *)0x0) {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      fprintf(__stream,"Memory allocation failed (%s:%d, %s)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/tools/lint/commands.c"
              ,0x45b,pcVar2);
      goto LAB_0010a32e;
    }
    *(char **)(pcVar2 + (long)(int)outformat * 8) = _argc;
    outformat = outformat + LYD_XML;
    ptr = pcVar2;
  }
  pcVar2 = ptr + (long)(int)outformat * 8;
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  _optind = LYD_UNKNOWN;
LAB_0010a1fd:
  do {
    rlcd._4_4_ = 0;
    option_index = getopt_long(outformat,ptr,"hf:",cmd_list::long_options,(long)&rlcd + 4);
    if (option_index == -1) {
      if (_optind == outformat) {
        free(*(void **)ptr);
        free(ptr);
        iVar1 = print_list(_stdout,ctx,(LYD_FORMAT)rlcd);
        return iVar1;
      }
      fprintf(_stderr,"Unknown parameter \"%s\"\n",*(undefined8 *)(ptr + (long)(int)_optind * 8));
LAB_0010a32e:
      free(*(void **)ptr);
      free(ptr);
      return 1;
    }
    if (option_index == 0x3f) goto LAB_0010a32e;
    if (option_index == 0x66) {
      iVar1 = strcmp(_optarg,"xml");
      if (iVar1 == 0) {
        rlcd._0_4_ = LYD_XML;
      }
      else {
        iVar1 = strcmp(_optarg,"json");
        if (iVar1 != 0) {
          fprintf(_stderr,"Unknown output format \"%s\".\n",_optarg);
          goto LAB_0010a32e;
        }
        rlcd._0_4_ = LYD_JSON;
      }
      goto LAB_0010a1fd;
    }
    if (option_index == 0x68) {
      cmd_data_help();
      free(*(void **)ptr);
      free(ptr);
      return 0;
    }
  } while( true );
}

Assistant:

int
cmd_list(const char *arg)
{
    char **argv = NULL, *ptr;
    int c, argc, option_index;
    LYD_FORMAT outformat = LYD_UNKNOWN;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc+2)*sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto error;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "hf:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_data_help();
            free(*argv);
            free(argv);
            return 0;
        case 'f':
            if (!strcmp(optarg, "xml")) {
                outformat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                outformat = LYD_JSON;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto error;
            }
            break;
        case '?':
            /* getopt_long() prints message */
            goto error;
        }
    }
    if (optind != argc) {
        fprintf(stderr, "Unknown parameter \"%s\"\n", argv[optind]);
error:
        free(*argv);
        free(argv);
        return 1;
    }
    free(*argv);
    free(argv);

    return print_list(stdout, ctx, outformat);
}